

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matroskaParser.cpp
# Opt level: O3

void __thiscall
ParsedPGTrackData::extractData(ParsedPGTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  undefined1 auVar1 [16];
  int iVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  int iVar5;
  uint8_t *puVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint8_t *puVar9;
  
  puVar7 = buff + (long)size + -3;
  puVar6 = buff;
  iVar2 = size;
  do {
    iVar5 = iVar2;
    if (puVar7 < puVar6) break;
    uVar3 = AV_RB16(puVar6 + 1);
    puVar6 = puVar6 + (ushort)(uVar3 + 3);
    iVar2 = iVar5 + 10;
  } while ((uint16_t)(uVar3 + 3) != 0);
  if (puVar6 == buff + size) {
    pkt->size = iVar5;
    uVar8 = (ulong)iVar5;
    puVar6 = (uint8_t *)operator_new__(uVar8);
    pkt->data = puVar6;
    puVar9 = puVar6;
    if (buff <= puVar7) {
      do {
        uVar3 = AV_RB16(buff + 1);
        puVar9[0] = 'P';
        puVar9[1] = 'G';
        auVar1 = SEXT816(0x4754ea55f5d46497) * SEXT816(pkt->pts);
        uVar4 = my_ntohl((int)(auVar1._8_8_ >> 0xe) - (auVar1._12_4_ >> 0x1f));
        *(uint32_t *)(puVar9 + 2) = uVar4;
        puVar9[6] = '\0';
        puVar9[7] = '\0';
        puVar9[8] = '\0';
        puVar9[9] = '\0';
        uVar8 = (ulong)(ushort)(uVar3 + 3);
        memcpy(puVar9 + 10,buff,uVar8);
        buff = buff + uVar8;
        puVar9 = puVar9 + uVar8 + 10;
      } while (buff <= puVar7);
      puVar6 = pkt->data;
      uVar8 = (ulong)pkt->size;
    }
    if (puVar9 != puVar6 + uVar8) {
      __assert_fail("dst == pkt->data + pkt->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/matroskaParser.cpp"
                    ,0x1b1,
                    "virtual void ParsedPGTrackData::extractData(AVPacket *, uint8_t *, const int)")
      ;
    }
  }
  else {
    pkt->size = 0;
    pkt->data = (uint8_t *)0x0;
  }
  return;
}

Assistant:

void ParsedPGTrackData::extractData(AVPacket* pkt, uint8_t* buff, const int size)
{
    static constexpr int PG_HEADER_SIZE = 10;

    const uint8_t* curPtr = buff;
    const uint8_t* end = buff + size;
    int blocks = 0;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;
        if (blockSize == 0)
            break;
        curPtr += blockSize;
        blocks++;
    }
    // assert(curPtr == end);
    if (curPtr != end)
    {
        pkt->size = 0;
        pkt->data = nullptr;
        return;  // ignore invalid packet
    }

    pkt->size = size + PG_HEADER_SIZE * blocks;
    pkt->data = new uint8_t[pkt->size];
    curPtr = buff;
    uint8_t* dst = pkt->data;
    while (curPtr <= end - 3)
    {
        const uint16_t blockSize = AV_RB16(curPtr + 1) + 3;

        dst[0] = 'P';
        dst[1] = 'G';
        const auto ptsDts = reinterpret_cast<uint32_t*>(dst + 2);
        ptsDts[0] = my_htonl(static_cast<uint32_t>(internalClockToPts(pkt->pts)));
        ptsDts[1] = 0;
        dst += PG_HEADER_SIZE;
        memcpy(dst, curPtr, blockSize);
        curPtr += blockSize;
        dst += blockSize;
    }
    assert(dst == pkt->data + pkt->size);
}